

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavUpdate(void)

{
  float *pfVar1;
  ImGuiID IVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImVec2 *pIVar6;
  ImGuiPopupData *pIVar7;
  bool bVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  float lhs;
  ImVec2 IVar12;
  float local_10c;
  float local_f4;
  bool local_ec;
  bool local_eb;
  byte local_ea;
  float local_e8;
  float local_e4;
  ImVec2 local_dc;
  ImVec2 local_d4;
  ImRect local_cc;
  undefined1 local_bc [8];
  ImRect nav_rect_rel;
  float pad;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  undefined1 local_70 [8];
  ImRect window_rect_rel;
  ImGuiWindow *window_1;
  float fStack_50;
  ImVec2 scroll_dir;
  float scroll_speed;
  ImGuiWindow *window;
  float nav_scoring_rect_offset_y;
  ImGuiInputReadMode read_mode;
  bool activate_pressed;
  bool activate_down;
  ImGuiWindow *parent_window;
  ImGuiWindow *child_window;
  int local_18;
  int i;
  bool nav_gamepad_active;
  bool nav_keyboard_active;
  ImGuiContext *g;
  
  pIVar4 = GImGui;
  (GImGui->IO).WantSetMousePos = false;
  bVar8 = ((pIVar4->IO).ConfigFlags & 1U) != 0;
  bVar9 = false;
  if (((pIVar4->IO).ConfigFlags & 2U) != 0) {
    bVar9 = ((pIVar4->IO).BackendFlags & 1U) != 0;
  }
  if ((bVar9) &&
     ((((0.0 < (pIVar4->IO).NavInputs[0] || (0.0 < (pIVar4->IO).NavInputs[2])) ||
       (0.0 < (pIVar4->IO).NavInputs[1])) || (0.0 < (pIVar4->IO).NavInputs[3])))) {
    pIVar4->NavInputSource = ImGuiInputSource_NavGamepad;
  }
  if (bVar8) {
    bVar5 = IsKeyDown((pIVar4->IO).KeyMap[0xc]);
    if (bVar5) {
      (pIVar4->IO).NavInputs[0] = 1.0;
      pIVar4->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar5 = IsKeyDown((pIVar4->IO).KeyMap[0xd]);
    if (bVar5) {
      (pIVar4->IO).NavInputs[2] = 1.0;
      pIVar4->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar5 = IsKeyDown((pIVar4->IO).KeyMap[0xe]);
    if (bVar5) {
      (pIVar4->IO).NavInputs[1] = 1.0;
      pIVar4->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar5 = IsKeyDown((pIVar4->IO).KeyMap[1]);
    if (bVar5) {
      (pIVar4->IO).NavInputs[0x11] = 1.0;
      pIVar4->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar5 = IsKeyDown((pIVar4->IO).KeyMap[2]);
    if (bVar5) {
      (pIVar4->IO).NavInputs[0x12] = 1.0;
      pIVar4->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar5 = IsKeyDown((pIVar4->IO).KeyMap[3]);
    if (bVar5) {
      (pIVar4->IO).NavInputs[0x13] = 1.0;
      pIVar4->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar5 = IsKeyDown((pIVar4->IO).KeyMap[4]);
    if (bVar5) {
      (pIVar4->IO).NavInputs[0x14] = 1.0;
      pIVar4->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    if (((pIVar4->IO).KeyCtrl & 1U) != 0) {
      (pIVar4->IO).NavInputs[0xe] = 1.0;
    }
    if (((pIVar4->IO).KeyShift & 1U) != 0) {
      (pIVar4->IO).NavInputs[0xf] = 1.0;
    }
    if ((((pIVar4->IO).KeyAlt & 1U) != 0) && (((pIVar4->IO).KeyCtrl & 1U) == 0)) {
      (pIVar4->IO).NavInputs[0x10] = 1.0;
    }
  }
  memcpy((pIVar4->IO).NavInputsDownDurationPrev,(pIVar4->IO).NavInputsDownDuration,0x54);
  for (local_18 = 0; local_18 < 0x15; local_18 = local_18 + 1) {
    if ((pIVar4->IO).NavInputs[local_18] <= 0.0) {
      local_e8 = -1.0;
    }
    else {
      pfVar1 = (pIVar4->IO).NavInputsDownDuration + local_18;
      if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
        local_e4 = (pIVar4->IO).NavInputsDownDuration[local_18] + (pIVar4->IO).DeltaTime;
      }
      else {
        local_e4 = 0.0;
      }
      local_e8 = local_e4;
    }
    (pIVar4->IO).NavInputsDownDuration[local_18] = local_e8;
  }
  if (((pIVar4->NavInitResultId != 0) &&
      (((pIVar4->NavDisableHighlight & 1U) == 0 || ((pIVar4->NavInitRequestFromMove & 1U) != 0))))
     && (pIVar4->NavWindow != (ImGuiWindow *)0x0)) {
    if ((pIVar4->NavInitRequestFromMove & 1U) == 0) {
      SetNavID(pIVar4->NavInitResultId,pIVar4->NavLayer,0);
    }
    else {
      SetNavIDWithRectRel(pIVar4->NavInitResultId,pIVar4->NavLayer,0,&pIVar4->NavInitResultRectRel);
    }
    pIVar6 = &pIVar4->NavWindow->NavRectRel[pIVar4->NavLayer].Min;
    *pIVar6 = (pIVar4->NavInitResultRectRel).Min;
    pIVar6[1] = (pIVar4->NavInitResultRectRel).Max;
  }
  pIVar4->NavInitRequest = false;
  pIVar4->NavInitRequestFromMove = false;
  pIVar4->NavInitResultId = 0;
  pIVar4->NavJustMovedToId = 0;
  if ((pIVar4->NavMoveRequest & 1U) != 0) {
    NavUpdateMoveResult();
  }
  if (pIVar4->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if ((pIVar4->NavMoveRequest & 1U) == 0) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x2097,"void ImGui::NavUpdate()");
    }
    if (((pIVar4->NavMoveResultLocal).ID == 0) && ((pIVar4->NavMoveResultOther).ID == 0)) {
      pIVar4->NavDisableHighlight = false;
    }
    pIVar4->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if (((pIVar4->NavMousePosDirty & 1U) != 0) && ((pIVar4->NavIdIsAlive & 1U) != 0)) {
    if (((((pIVar4->IO).ConfigFlags & 4U) != 0) &&
        (((((pIVar4->IO).BackendFlags & 4U) != 0 && ((pIVar4->NavDisableHighlight & 1U) == 0)) &&
         ((pIVar4->NavDisableMouseHover & 1U) != 0)))) && (pIVar4->NavWindow != (ImGuiWindow *)0x0))
    {
      IVar12 = NavCalcPreferredRefPos();
      (pIVar4->IO).MousePosPrev = IVar12;
      (pIVar4->IO).MousePos = (pIVar4->IO).MousePosPrev;
      (pIVar4->IO).WantSetMousePos = true;
    }
    pIVar4->NavMousePosDirty = false;
  }
  pIVar4->NavIdIsAlive = false;
  pIVar4->NavJustTabbedId = 0;
  bVar5 = true;
  if (pIVar4->NavLayer != ImGuiNavLayer_Main) {
    bVar5 = pIVar4->NavLayer == ImGuiNavLayer_Menu;
  }
  if (!bVar5) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x20ad,"void ImGui::NavUpdate()");
  }
  if (pIVar4->NavWindow != (ImGuiWindow *)0x0) {
    NavSaveLastChildNavWindowIntoParent(pIVar4->NavWindow);
  }
  if (((pIVar4->NavWindow != (ImGuiWindow *)0x0) &&
      (pIVar4->NavWindow->NavLastChildNavWindow != (ImGuiWindow *)0x0)) &&
     (pIVar4->NavLayer == ImGuiNavLayer_Main)) {
    pIVar4->NavWindow->NavLastChildNavWindow = (ImGuiWindow *)0x0;
  }
  NavUpdateWindowing();
  if (((bVar8) || (local_ea = 0, bVar9)) && (local_ea = 0, pIVar4->NavWindow != (ImGuiWindow *)0x0))
  {
    local_ea = (pIVar4->NavWindow->Flags & 0x40000U) != 0 ^ 0xff;
  }
  (pIVar4->IO).NavActive = (bool)(local_ea & 1);
  if (((((pIVar4->IO).NavActive & 1U) == 0) || (pIVar4->NavId == 0)) ||
     (local_eb = true, (pIVar4->NavDisableHighlight & 1U) != 0)) {
    local_eb = pIVar4->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  (pIVar4->IO).NavVisible = local_eb;
  bVar9 = IsNavInputTest(1,ImGuiInputReadMode_Pressed);
  if (bVar9) {
    if (pIVar4->ActiveId == 0) {
      if (((pIVar4->NavWindow == (ImGuiWindow *)0x0) ||
          ((pIVar4->NavWindow->Flags & 0x1000000U) == 0)) ||
         (((pIVar4->NavWindow->Flags & 0x4000000U) != 0 ||
          (pIVar4->NavWindow->ParentWindow == (ImGuiWindow *)0x0)))) {
        if ((pIVar4->OpenPopupStack).Size < 1) {
          if (pIVar4->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar4->NavWindow != (ImGuiWindow *)0x0) &&
               (((pIVar4->NavWindow->Flags & 0x4000000U) != 0 ||
                ((pIVar4->NavWindow->Flags & 0x1000000U) == 0)))) {
              pIVar4->NavWindow->NavLastIds[0] = 0;
            }
            pIVar4->NavFocusScopeId = 0;
            pIVar4->NavId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else {
          pIVar7 = ImVector<ImGuiPopupData>::back(&pIVar4->OpenPopupStack);
          if ((pIVar7->Window->Flags & 0x8000000U) == 0) {
            ClosePopupToLevel((pIVar4->OpenPopupStack).Size + -1,true);
          }
        }
      }
      else {
        pIVar3 = pIVar4->NavWindow;
        if (pIVar3->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                        ,0x20c9,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar4->NavWindow->ParentWindow);
        SetNavID(pIVar3->ChildId,0,0);
        pIVar4->NavIdIsAlive = false;
        if ((pIVar4->NavDisableMouseHover & 1U) != 0) {
          pIVar4->NavMousePosDirty = true;
        }
      }
    }
    else {
      bVar9 = IsActiveIdUsingNavInput(1);
      if (!bVar9) {
        ClearActiveID();
      }
    }
  }
  pIVar4->NavInputId = 0;
  pIVar4->NavActivatePressedId = 0;
  pIVar4->NavActivateDownId = 0;
  pIVar4->NavActivateId = 0;
  if ((((pIVar4->NavId != 0) && ((pIVar4->NavDisableHighlight & 1U) == 0)) &&
      (pIVar4->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
     ((pIVar4->NavWindow != (ImGuiWindow *)0x0 && ((pIVar4->NavWindow->Flags & 0x40000U) == 0)))) {
    bVar9 = IsNavInputDown(0);
    local_ec = false;
    if (bVar9) {
      local_ec = IsNavInputTest(0,ImGuiInputReadMode_Pressed);
    }
    if ((pIVar4->ActiveId == 0) && (local_ec != false)) {
      pIVar4->NavActivateId = pIVar4->NavId;
    }
    if (((pIVar4->ActiveId == 0) || (pIVar4->ActiveId == pIVar4->NavId)) && (bVar9)) {
      pIVar4->NavActivateDownId = pIVar4->NavId;
    }
    if (((pIVar4->ActiveId == 0) || (pIVar4->ActiveId == pIVar4->NavId)) && (local_ec != false)) {
      pIVar4->NavActivatePressedId = pIVar4->NavId;
    }
    if (((pIVar4->ActiveId == 0) || (pIVar4->ActiveId == pIVar4->NavId)) &&
       (bVar9 = IsNavInputTest(2,ImGuiInputReadMode_Pressed), bVar9)) {
      pIVar4->NavInputId = pIVar4->NavId;
    }
  }
  if ((pIVar4->NavWindow != (ImGuiWindow *)0x0) && ((pIVar4->NavWindow->Flags & 0x40000U) != 0)) {
    pIVar4->NavDisableHighlight = true;
  }
  if ((pIVar4->NavActivateId != 0) && (pIVar4->NavActivateDownId != pIVar4->NavActivateId)) {
    __assert_fail("g.NavActivateDownId == g.NavActivateId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x20f7,"void ImGui::NavUpdate()");
  }
  pIVar4->NavMoveRequest = false;
  if (pIVar4->NavNextActivateId != 0) {
    IVar2 = pIVar4->NavNextActivateId;
    pIVar4->NavInputId = IVar2;
    pIVar4->NavActivatePressedId = IVar2;
    pIVar4->NavActivateDownId = IVar2;
    pIVar4->NavActivateId = IVar2;
  }
  pIVar4->NavNextActivateId = 0;
  if (pIVar4->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar4->NavMoveDir = -1;
    pIVar4->NavMoveRequestFlags = 0;
    if (((pIVar4->NavWindow != (ImGuiWindow *)0x0) &&
        (pIVar4->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar4->NavWindow->Flags & 0x40000U) == 0)) {
      bVar9 = IsActiveIdUsingNavDir(0);
      if ((!bVar9) &&
         ((bVar9 = IsNavInputTest(4,ImGuiInputReadMode_Repeat), bVar9 ||
          (bVar9 = IsNavInputTest(0x11,ImGuiInputReadMode_Repeat), bVar9)))) {
        pIVar4->NavMoveDir = 0;
      }
      bVar9 = IsActiveIdUsingNavDir(1);
      if ((!bVar9) &&
         ((bVar9 = IsNavInputTest(5,ImGuiInputReadMode_Repeat), bVar9 ||
          (bVar9 = IsNavInputTest(0x12,ImGuiInputReadMode_Repeat), bVar9)))) {
        pIVar4->NavMoveDir = 1;
      }
      bVar9 = IsActiveIdUsingNavDir(2);
      if ((!bVar9) &&
         ((bVar9 = IsNavInputTest(6,ImGuiInputReadMode_Repeat), bVar9 ||
          (bVar9 = IsNavInputTest(0x13,ImGuiInputReadMode_Repeat), bVar9)))) {
        pIVar4->NavMoveDir = 2;
      }
      bVar9 = IsActiveIdUsingNavDir(3);
      if ((!bVar9) &&
         ((bVar9 = IsNavInputTest(7,ImGuiInputReadMode_Repeat), bVar9 ||
          (bVar9 = IsNavInputTest(0x14,ImGuiInputReadMode_Repeat), bVar9)))) {
        pIVar4->NavMoveDir = 3;
      }
    }
    pIVar4->NavMoveClipDir = pIVar4->NavMoveDir;
  }
  else {
    bVar9 = false;
    if (pIVar4->NavMoveDir != -1) {
      bVar9 = pIVar4->NavMoveClipDir != -1;
    }
    if (!bVar9) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x2112,"void ImGui::NavUpdate()");
    }
    if (pIVar4->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x2113,"void ImGui::NavUpdate()");
    }
    pIVar4->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  window._4_4_ = 0.0;
  if (bVar8) {
    window._4_4_ = NavUpdatePageUpPageDown();
  }
  if (pIVar4->NavMoveDir != -1) {
    pIVar4->NavMoveRequest = true;
    pIVar4->NavMoveDirLast = pIVar4->NavMoveDir;
  }
  if (((pIVar4->NavMoveRequest & 1U) != 0) && (pIVar4->NavId == 0)) {
    pIVar4->NavInitRequestFromMove = true;
    pIVar4->NavInitRequest = true;
    pIVar4->NavInitResultId = 0;
    pIVar4->NavDisableHighlight = false;
  }
  NavUpdateAnyRequestFlag();
  if (((pIVar4->NavWindow != (ImGuiWindow *)0x0) && ((pIVar4->NavWindow->Flags & 0x40000U) == 0)) &&
     (pIVar4->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    pIVar3 = pIVar4->NavWindow;
    fVar10 = ImGuiWindow::CalcFontSize(pIVar3);
    fVar10 = (float)(int)(fVar10 * 100.0 * (pIVar4->IO).DeltaTime + 0.5);
    if ((((pIVar3->DC).NavLayerActiveMask == 0) && (((pIVar3->DC).NavHasScroll & 1U) != 0)) &&
       ((pIVar4->NavMoveRequest & 1U) != 0)) {
      if ((pIVar4->NavMoveDir == 0) || (pIVar4->NavMoveDir == 1)) {
        local_f4 = -1.0;
        if (pIVar4->NavMoveDir != 0) {
          local_f4 = 1.0;
        }
        fVar11 = ImFloor(local_f4 * fVar10 + (pIVar3->Scroll).x);
        SetScrollX(pIVar3,fVar11);
      }
      if ((pIVar4->NavMoveDir == 2) || (pIVar4->NavMoveDir == 3)) {
        local_10c = -1.0;
        if (pIVar4->NavMoveDir != 2) {
          local_10c = 1.0;
        }
        fVar11 = ImFloor(local_10c * fVar10 + (pIVar3->Scroll).y);
        SetScrollY(pIVar3,fVar11);
      }
    }
    IVar12 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    window_1._4_4_ = IVar12.x;
    if (((window_1._4_4_ != 0.0) || (NAN(window_1._4_4_))) && ((pIVar3->ScrollbarX & 1U) != 0)) {
      fVar11 = ImFloor(window_1._4_4_ * fVar10 + (pIVar3->Scroll).x);
      SetScrollX(pIVar3,fVar11);
      pIVar4->NavMoveFromClampedRefRect = true;
    }
    fStack_50 = IVar12.y;
    if ((fStack_50 != 0.0) || (NAN(fStack_50))) {
      fVar10 = ImFloor(fStack_50 * fVar10 + (pIVar3->Scroll).y);
      SetScrollY(pIVar3,fVar10);
      pIVar4->NavMoveFromClampedRefRect = true;
    }
  }
  ImGuiNavMoveResult::Clear(&pIVar4->NavMoveResultLocal);
  ImGuiNavMoveResult::Clear(&pIVar4->NavMoveResultLocalVisibleSet);
  ImGuiNavMoveResult::Clear(&pIVar4->NavMoveResultOther);
  if ((((pIVar4->NavMoveRequest & 1U) != 0) && ((pIVar4->NavMoveFromClampedRefRect & 1U) != 0)) &&
     (pIVar4->NavLayer == ImGuiNavLayer_Main)) {
    window_rect_rel.Max = (ImVec2)pIVar4->NavWindow;
    local_80 = ::operator-((ImVec2 *)((long)window_rect_rel.Max + 0x228),
                           (ImVec2 *)((long)window_rect_rel.Max + 0x10));
    ImVec2::ImVec2(&local_88,1.0,1.0);
    local_78 = ::operator-(&local_80,&local_88);
    local_98 = ::operator-((ImVec2 *)((long)window_rect_rel.Max + 0x230),
                           (ImVec2 *)((long)window_rect_rel.Max + 0x10));
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff60,1.0,1.0);
    local_90 = ::operator+(&local_98,(ImVec2 *)&stack0xffffffffffffff60);
    ImRect::ImRect((ImRect *)local_70,&local_78,&local_90);
    bVar9 = ImRect::Contains((ImRect *)local_70,
                             (ImRect *)
                             ((long)window_rect_rel.Max + 0x390 + (ulong)pIVar4->NavLayer * 0x10));
    if (!bVar9) {
      fVar10 = ImGuiWindow::CalcFontSize((ImGuiWindow *)window_rect_rel.Max);
      fVar11 = ImRect::GetWidth((ImRect *)local_70);
      fVar11 = ImMin<float>(fVar11,fVar10 * 0.5);
      lhs = ImRect::GetHeight((ImRect *)local_70);
      fVar10 = ImMin<float>(lhs,fVar10 * 0.5);
      ImVec2::ImVec2(&nav_rect_rel.Max,-fVar11,-fVar10);
      ImRect::Expand((ImRect *)local_70,&nav_rect_rel.Max);
      ImRect::ClipWith((ImRect *)
                       ((long)window_rect_rel.Max + 0x390 + (ulong)pIVar4->NavLayer * 0x10),
                       (ImRect *)local_70);
      pIVar4->NavFocusScopeId = 0;
      pIVar4->NavId = 0;
    }
    pIVar4->NavMoveFromClampedRefRect = false;
  }
  if ((pIVar4->NavWindow == (ImGuiWindow *)0x0) ||
     (bVar9 = ImRect::IsInverted(pIVar4->NavWindow->NavRectRel + pIVar4->NavLayer), bVar9)) {
    ImRect::ImRect((ImRect *)local_bc,0.0,0.0,0.0,0.0);
  }
  else {
    pIVar6 = &pIVar4->NavWindow->NavRectRel[pIVar4->NavLayer].Min;
    local_bc = *(undefined1 (*) [8])pIVar6;
    nav_rect_rel.Min = pIVar6[1];
  }
  if (pIVar4->NavWindow == (ImGuiWindow *)0x0) {
    local_cc = GetViewportRect();
  }
  else {
    local_d4 = ::operator+(&pIVar4->NavWindow->Pos,(ImVec2 *)local_bc);
    local_dc = ::operator+(&pIVar4->NavWindow->Pos,&nav_rect_rel.Min);
    ImRect::ImRect(&local_cc,&local_d4,&local_dc);
  }
  (pIVar4->NavScoringRectScreen).Min = local_cc.Min;
  (pIVar4->NavScoringRectScreen).Max = local_cc.Max;
  ImRect::TranslateY(&pIVar4->NavScoringRectScreen,window._4_4_);
  fVar10 = ImMin<float>((pIVar4->NavScoringRectScreen).Min.x + 1.0,
                        (pIVar4->NavScoringRectScreen).Max.x);
  (pIVar4->NavScoringRectScreen).Min.x = fVar10;
  (pIVar4->NavScoringRectScreen).Max.x = (pIVar4->NavScoringRectScreen).Min.x;
  bVar9 = ImRect::IsInverted(&pIVar4->NavScoringRectScreen);
  if (((bVar9 ^ 0xffU) & 1) != 0) {
    pIVar4->NavScoringCount = 0;
    return;
  }
  __assert_fail("!g.NavScoringRectScreen.IsInverted()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                ,0x2164,"void ImGui::NavUpdate()");
}

Assistant:

static void ImGui::NavUpdate()
{
    ImGuiContext& g = *GImGui;
    g.IO.WantSetMousePos = false;
#if 0
    if (g.NavScoringCount > 0) IMGUI_DEBUG_LOG("NavScoringCount %d for '%s' layer %d (Init:%d, Move:%d)\n", g.FrameCount, g.NavScoringCount, g.NavWindow ? g.NavWindow->Name : "NULL", g.NavLayer, g.NavInitRequest || g.NavInitResultId != 0, g.NavMoveRequest);
#endif

    // Set input source as Gamepad when buttons are pressed before we map Keyboard (some features differs when used with Gamepad vs Keyboard)
    bool nav_keyboard_active = (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) != 0;
    bool nav_gamepad_active = (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableGamepad) != 0 && (g.IO.BackendFlags & ImGuiBackendFlags_HasGamepad) != 0;
    if (nav_gamepad_active)
        if (g.IO.NavInputs[ImGuiNavInput_Activate] > 0.0f || g.IO.NavInputs[ImGuiNavInput_Input] > 0.0f || g.IO.NavInputs[ImGuiNavInput_Cancel] > 0.0f || g.IO.NavInputs[ImGuiNavInput_Menu] > 0.0f)
            g.NavInputSource = ImGuiInputSource_NavGamepad;

    // Update Keyboard->Nav inputs mapping
    if (nav_keyboard_active)
    {
        #define NAV_MAP_KEY(_KEY, _NAV_INPUT)  do { if (IsKeyDown(g.IO.KeyMap[_KEY])) { g.IO.NavInputs[_NAV_INPUT] = 1.0f; g.NavInputSource = ImGuiInputSource_NavKeyboard; } } while (0)
        NAV_MAP_KEY(ImGuiKey_Space,     ImGuiNavInput_Activate );
        NAV_MAP_KEY(ImGuiKey_Enter,     ImGuiNavInput_Input    );
        NAV_MAP_KEY(ImGuiKey_Escape,    ImGuiNavInput_Cancel   );
        NAV_MAP_KEY(ImGuiKey_LeftArrow, ImGuiNavInput_KeyLeft_ );
        NAV_MAP_KEY(ImGuiKey_RightArrow,ImGuiNavInput_KeyRight_);
        NAV_MAP_KEY(ImGuiKey_UpArrow,   ImGuiNavInput_KeyUp_   );
        NAV_MAP_KEY(ImGuiKey_DownArrow, ImGuiNavInput_KeyDown_ );
        if (g.IO.KeyCtrl)
            g.IO.NavInputs[ImGuiNavInput_TweakSlow] = 1.0f;
        if (g.IO.KeyShift)
            g.IO.NavInputs[ImGuiNavInput_TweakFast] = 1.0f;
        if (g.IO.KeyAlt && !g.IO.KeyCtrl) // AltGR is Alt+Ctrl, also even on keyboards without AltGR we don't want Alt+Ctrl to open menu.
            g.IO.NavInputs[ImGuiNavInput_KeyMenu_]  = 1.0f;
        #undef NAV_MAP_KEY
    }
    memcpy(g.IO.NavInputsDownDurationPrev, g.IO.NavInputsDownDuration, sizeof(g.IO.NavInputsDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.NavInputs); i++)
        g.IO.NavInputsDownDuration[i] = (g.IO.NavInputs[i] > 0.0f) ? (g.IO.NavInputsDownDuration[i] < 0.0f ? 0.0f : g.IO.NavInputsDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Process navigation init request (select first/default focus)
    // In very rare cases g.NavWindow may be null (e.g. clearing focus after requesting an init request, which does happen when releasing Alt while clicking on void)
    if (g.NavInitResultId != 0 && (!g.NavDisableHighlight || g.NavInitRequestFromMove) && g.NavWindow)
    {
        // Apply result from previous navigation init request (will typically select the first item, unless SetItemDefaultFocus() has been called)
        //IMGUI_DEBUG_LOG("[Nav] Apply NavInitRequest result: 0x%08X Layer %d in \"%s\"\n", g.NavInitResultId, g.NavLayer, g.NavWindow->Name);
        if (g.NavInitRequestFromMove)
            SetNavIDWithRectRel(g.NavInitResultId, g.NavLayer, 0, g.NavInitResultRectRel);
        else
            SetNavID(g.NavInitResultId, g.NavLayer, 0);
        g.NavWindow->NavRectRel[g.NavLayer] = g.NavInitResultRectRel;
    }
    g.NavInitRequest = false;
    g.NavInitRequestFromMove = false;
    g.NavInitResultId = 0;
    g.NavJustMovedToId = 0;

    // Process navigation move request
    if (g.NavMoveRequest)
        NavUpdateMoveResult();

    // When a forwarded move request failed, we restore the highlight that we disabled during the forward frame
    if (g.NavMoveRequestForward == ImGuiNavForward_ForwardActive)
    {
        IM_ASSERT(g.NavMoveRequest);
        if (g.NavMoveResultLocal.ID == 0 && g.NavMoveResultOther.ID == 0)
            g.NavDisableHighlight = false;
        g.NavMoveRequestForward = ImGuiNavForward_None;
    }

    // Apply application mouse position movement, after we had a chance to process move request result.
    if (g.NavMousePosDirty && g.NavIdIsAlive)
    {
        // Set mouse position given our knowledge of the navigated item position from last frame
        if ((g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableSetMousePos) && (g.IO.BackendFlags & ImGuiBackendFlags_HasSetMousePos))
        {
            if (!g.NavDisableHighlight && g.NavDisableMouseHover && g.NavWindow)
            {
                g.IO.MousePos = g.IO.MousePosPrev = NavCalcPreferredRefPos();
                g.IO.WantSetMousePos = true;
            }
        }
        g.NavMousePosDirty = false;
    }
    g.NavIdIsAlive = false;
    g.NavJustTabbedId = 0;
    IM_ASSERT(g.NavLayer == 0 || g.NavLayer == 1);

    // Store our return window (for returning from Layer 1 to Layer 0) and clear it as soon as we step back in our own Layer 0
    if (g.NavWindow)
        NavSaveLastChildNavWindowIntoParent(g.NavWindow);
    if (g.NavWindow && g.NavWindow->NavLastChildNavWindow != NULL && g.NavLayer == 0)
        g.NavWindow->NavLastChildNavWindow = NULL;

    // Update CTRL+TAB and Windowing features (hold Square to move/resize/etc.)
    NavUpdateWindowing();

    // Set output flags for user application
    g.IO.NavActive = (nav_keyboard_active || nav_gamepad_active) && g.NavWindow && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs);
    g.IO.NavVisible = (g.IO.NavActive && g.NavId != 0 && !g.NavDisableHighlight) || (g.NavWindowingTarget != NULL);

    // Process NavCancel input (to close a popup, get back to parent, clear focus)
    if (IsNavInputTest(ImGuiNavInput_Cancel, ImGuiInputReadMode_Pressed))
    {
        if (g.ActiveId != 0)
        {
            if (!IsActiveIdUsingNavInput(ImGuiNavInput_Cancel))
                ClearActiveID();
        }
        else if (g.NavWindow && (g.NavWindow->Flags & ImGuiWindowFlags_ChildWindow) && !(g.NavWindow->Flags & ImGuiWindowFlags_Popup) && g.NavWindow->ParentWindow)
        {
            // Exit child window
            ImGuiWindow* child_window = g.NavWindow;
            ImGuiWindow* parent_window = g.NavWindow->ParentWindow;
            IM_ASSERT(child_window->ChildId != 0);
            FocusWindow(parent_window);
            SetNavID(child_window->ChildId, 0, 0);
            // Reassigning with same value, we're being explicit here.
            g.NavIdIsAlive = false;     // -V1048
            if (g.NavDisableMouseHover)
                g.NavMousePosDirty = true;
        }
        else if (g.OpenPopupStack.Size > 0)
        {
            // Close open popup/menu
            if (!(g.OpenPopupStack.back().Window->Flags & ImGuiWindowFlags_Modal))
                ClosePopupToLevel(g.OpenPopupStack.Size - 1, true);
        }
        else if (g.NavLayer != 0)
        {
            // Leave the "menu" layer
            NavRestoreLayer(ImGuiNavLayer_Main);
        }
        else
        {
            // Clear NavLastId for popups but keep it for regular child window so we can leave one and come back where we were
            if (g.NavWindow && ((g.NavWindow->Flags & ImGuiWindowFlags_Popup) || !(g.NavWindow->Flags & ImGuiWindowFlags_ChildWindow)))
                g.NavWindow->NavLastIds[0] = 0;
            g.NavId = g.NavFocusScopeId = 0;
        }
    }

    // Process manual activation request
    g.NavActivateId = g.NavActivateDownId = g.NavActivatePressedId = g.NavInputId = 0;
    if (g.NavId != 0 && !g.NavDisableHighlight && !g.NavWindowingTarget && g.NavWindow && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs))
    {
        bool activate_down = IsNavInputDown(ImGuiNavInput_Activate);
        bool activate_pressed = activate_down && IsNavInputTest(ImGuiNavInput_Activate, ImGuiInputReadMode_Pressed);
        if (g.ActiveId == 0 && activate_pressed)
            g.NavActivateId = g.NavId;
        if ((g.ActiveId == 0 || g.ActiveId == g.NavId) && activate_down)
            g.NavActivateDownId = g.NavId;
        if ((g.ActiveId == 0 || g.ActiveId == g.NavId) && activate_pressed)
            g.NavActivatePressedId = g.NavId;
        if ((g.ActiveId == 0 || g.ActiveId == g.NavId) && IsNavInputTest(ImGuiNavInput_Input, ImGuiInputReadMode_Pressed))
            g.NavInputId = g.NavId;
    }
    if (g.NavWindow && (g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs))
        g.NavDisableHighlight = true;
    if (g.NavActivateId != 0)
        IM_ASSERT(g.NavActivateDownId == g.NavActivateId);
    g.NavMoveRequest = false;

    // Process programmatic activation request
    if (g.NavNextActivateId != 0)
        g.NavActivateId = g.NavActivateDownId = g.NavActivatePressedId = g.NavInputId = g.NavNextActivateId;
    g.NavNextActivateId = 0;

    // Initiate directional inputs request
    if (g.NavMoveRequestForward == ImGuiNavForward_None)
    {
        g.NavMoveDir = ImGuiDir_None;
        g.NavMoveRequestFlags = ImGuiNavMoveFlags_None;
        if (g.NavWindow && !g.NavWindowingTarget && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs))
        {
            const ImGuiInputReadMode read_mode = ImGuiInputReadMode_Repeat;
            if (!IsActiveIdUsingNavDir(ImGuiDir_Left)  && (IsNavInputTest(ImGuiNavInput_DpadLeft,  read_mode) || IsNavInputTest(ImGuiNavInput_KeyLeft_,  read_mode))) { g.NavMoveDir = ImGuiDir_Left; }
            if (!IsActiveIdUsingNavDir(ImGuiDir_Right) && (IsNavInputTest(ImGuiNavInput_DpadRight, read_mode) || IsNavInputTest(ImGuiNavInput_KeyRight_, read_mode))) { g.NavMoveDir = ImGuiDir_Right; }
            if (!IsActiveIdUsingNavDir(ImGuiDir_Up)    && (IsNavInputTest(ImGuiNavInput_DpadUp,    read_mode) || IsNavInputTest(ImGuiNavInput_KeyUp_,    read_mode))) { g.NavMoveDir = ImGuiDir_Up; }
            if (!IsActiveIdUsingNavDir(ImGuiDir_Down)  && (IsNavInputTest(ImGuiNavInput_DpadDown,  read_mode) || IsNavInputTest(ImGuiNavInput_KeyDown_,  read_mode))) { g.NavMoveDir = ImGuiDir_Down; }
        }
        g.NavMoveClipDir = g.NavMoveDir;
    }
    else
    {
        // Forwarding previous request (which has been modified, e.g. wrap around menus rewrite the requests with a starting rectangle at the other side of the window)
        // (Preserve g.NavMoveRequestFlags, g.NavMoveClipDir which were set by the NavMoveRequestForward() function)
        IM_ASSERT(g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None);
        IM_ASSERT(g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued);
        g.NavMoveRequestForward = ImGuiNavForward_ForwardActive;
    }

    // Update PageUp/PageDown/Home/End scroll
    // FIXME-NAV: Consider enabling those keys even without the master ImGuiConfigFlags_NavEnableKeyboard flag?
    float nav_scoring_rect_offset_y = 0.0f;
    if (nav_keyboard_active)
        nav_scoring_rect_offset_y = NavUpdatePageUpPageDown();

    // If we initiate a movement request and have no current NavId, we initiate a InitDefautRequest that will be used as a fallback if the direction fails to find a match
    if (g.NavMoveDir != ImGuiDir_None)
    {
        g.NavMoveRequest = true;
        g.NavMoveDirLast = g.NavMoveDir;
    }
    if (g.NavMoveRequest && g.NavId == 0)
    {
        //IMGUI_DEBUG_LOG("[Nav] NavInitRequest from move, window \"%s\", layer=%d\n", g.NavWindow->Name, g.NavLayer);
        g.NavInitRequest = g.NavInitRequestFromMove = true;
        // Reassigning with same value, we're being explicit here.
        g.NavInitResultId = 0;     // -V1048
        g.NavDisableHighlight = false;
    }
    NavUpdateAnyRequestFlag();

    // Scrolling
    if (g.NavWindow && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.NavWindowingTarget)
    {
        // *Fallback* manual-scroll with Nav directional keys when window has no navigable item
        ImGuiWindow* window = g.NavWindow;
        const float scroll_speed = IM_ROUND(window->CalcFontSize() * 100 * g.IO.DeltaTime); // We need round the scrolling speed because sub-pixel scroll isn't reliably supported.
        if (window->DC.NavLayerActiveMask == 0x00 && window->DC.NavHasScroll && g.NavMoveRequest)
        {
            if (g.NavMoveDir == ImGuiDir_Left || g.NavMoveDir == ImGuiDir_Right)
                SetScrollX(window, ImFloor(window->Scroll.x + ((g.NavMoveDir == ImGuiDir_Left) ? -1.0f : +1.0f) * scroll_speed));
            if (g.NavMoveDir == ImGuiDir_Up || g.NavMoveDir == ImGuiDir_Down)
                SetScrollY(window, ImFloor(window->Scroll.y + ((g.NavMoveDir == ImGuiDir_Up) ? -1.0f : +1.0f) * scroll_speed));
        }

        // *Normal* Manual scroll with NavScrollXXX keys
        // Next movement request will clamp the NavId reference rectangle to the visible area, so navigation will resume within those bounds.
        ImVec2 scroll_dir = GetNavInputAmount2d(ImGuiNavDirSourceFlags_PadLStick, ImGuiInputReadMode_Down, 1.0f/10.0f, 10.0f);
        if (scroll_dir.x != 0.0f && window->ScrollbarX)
        {
            SetScrollX(window, ImFloor(window->Scroll.x + scroll_dir.x * scroll_speed));
            g.NavMoveFromClampedRefRect = true;
        }
        if (scroll_dir.y != 0.0f)
        {
            SetScrollY(window, ImFloor(window->Scroll.y + scroll_dir.y * scroll_speed));
            g.NavMoveFromClampedRefRect = true;
        }
    }

    // Reset search results
    g.NavMoveResultLocal.Clear();
    g.NavMoveResultLocalVisibleSet.Clear();
    g.NavMoveResultOther.Clear();

    // When we have manually scrolled (without using navigation) and NavId becomes out of bounds, we project its bounding box to the visible area to restart navigation within visible items
    if (g.NavMoveRequest && g.NavMoveFromClampedRefRect && g.NavLayer == 0)
    {
        ImGuiWindow* window = g.NavWindow;
        ImRect window_rect_rel(window->InnerRect.Min - window->Pos - ImVec2(1,1), window->InnerRect.Max - window->Pos + ImVec2(1,1));
        if (!window_rect_rel.Contains(window->NavRectRel[g.NavLayer]))
        {
            float pad = window->CalcFontSize() * 0.5f;
            window_rect_rel.Expand(ImVec2(-ImMin(window_rect_rel.GetWidth(), pad), -ImMin(window_rect_rel.GetHeight(), pad))); // Terrible approximation for the intent of starting navigation from first fully visible item
            window->NavRectRel[g.NavLayer].ClipWith(window_rect_rel);
            g.NavId = g.NavFocusScopeId = 0;
        }
        g.NavMoveFromClampedRefRect = false;
    }

    // For scoring we use a single segment on the left side our current item bounding box (not touching the edge to avoid box overlap with zero-spaced items)
    ImRect nav_rect_rel = (g.NavWindow && !g.NavWindow->NavRectRel[g.NavLayer].IsInverted()) ? g.NavWindow->NavRectRel[g.NavLayer] : ImRect(0,0,0,0);
    g.NavScoringRectScreen = g.NavWindow ? ImRect(g.NavWindow->Pos + nav_rect_rel.Min, g.NavWindow->Pos + nav_rect_rel.Max) : GetViewportRect();
    g.NavScoringRectScreen.TranslateY(nav_scoring_rect_offset_y);
    g.NavScoringRectScreen.Min.x = ImMin(g.NavScoringRectScreen.Min.x + 1.0f, g.NavScoringRectScreen.Max.x);
    g.NavScoringRectScreen.Max.x = g.NavScoringRectScreen.Min.x;
    IM_ASSERT(!g.NavScoringRectScreen.IsInverted()); // Ensure if we have a finite, non-inverted bounding box here will allows us to remove extraneous ImFabs() calls in NavScoreItem().
    //GetForegroundDrawList()->AddRect(g.NavScoringRectScreen.Min, g.NavScoringRectScreen.Max, IM_COL32(255,200,0,255)); // [DEBUG]
    g.NavScoringCount = 0;
#if IMGUI_DEBUG_NAV_RECTS
    if (g.NavWindow)
    {
        ImDrawList* draw_list = GetForegroundDrawList(g.NavWindow);
        if (1) { for (int layer = 0; layer < 2; layer++) draw_list->AddRect(g.NavWindow->Pos + g.NavWindow->NavRectRel[layer].Min, g.NavWindow->Pos + g.NavWindow->NavRectRel[layer].Max, IM_COL32(255,200,0,255)); } // [DEBUG]
        if (1) { ImU32 col = (!g.NavWindow->Hidden) ? IM_COL32(255,0,255,255) : IM_COL32(255,0,0,255); ImVec2 p = NavCalcPreferredRefPos(); char buf[32]; ImFormatString(buf, 32, "%d", g.NavLayer); draw_list->AddCircleFilled(p, 3.0f, col); draw_list->AddText(NULL, 13.0f, p + ImVec2(8,-4), col, buf); }
    }
#endif
}